

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O3

int isEndChunkEmpty(EndNoise *en,SurfaceNoise *sn,uint64_t seed,int chunkX,int chunkZ)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  uint uVar5;
  uint z;
  bool bVar6;
  bool bVar7;
  int z_00;
  uint uVar8;
  int iVar9;
  long lVar10;
  uint z_01;
  int *piVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  int iVar15;
  int x;
  float fVar16;
  float fVar17;
  double dVar18;
  long local_4e0;
  double depth [3] [3];
  int local_43c;
  float y [256];
  
  uVar5 = chunkX * 2;
  z = chunkZ * 2;
  x = chunkX * 0x10;
  z_00 = chunkZ * 0x10;
  iVar9 = -1;
  do {
    iVar15 = -1;
    do {
      uVar8 = getEndIslands((EndIsland *)y,en->mc,seed,iVar15 + chunkX,iVar9 + chunkZ);
      if (uVar8 != 0) {
        uVar12 = (ulong)uVar8 + 1;
        piVar11 = &local_43c + (ulong)uVar8 * 4;
        do {
          iVar1 = piVar11[-3];
          iVar2 = *piVar11;
          if ((((x < iVar2 + iVar1) && (iVar3 = piVar11[-1], z_00 < iVar3 + iVar2)) &&
              (iVar1 - iVar2 <= x + 0xf)) &&
             ((iVar3 - iVar2 <= z_00 + 0xf &&
              (mapEndBiome(en,(int *)depth,iVar1 >> 4,iVar3 >> 4,1,1), depth[0][0]._0_4_ == 0x28))))
          {
            return 0;
          }
          uVar12 = uVar12 - 1;
          piVar11 = piVar11 + -4;
        } while (1 < uVar12);
      }
      iVar15 = iVar15 + 1;
    } while (iVar15 != 2);
    iVar9 = iVar9 + 1;
    if (iVar9 == 2) {
      lVar10 = 0;
      bVar7 = true;
      do {
        bVar6 = bVar7;
        uVar8 = uVar5 | (uint)lVar10;
        lVar13 = 0;
        bVar7 = true;
        do {
          bVar14 = bVar7;
          z_01 = z | (uint)lVar13;
          fVar16 = getEndHeightNoise(en,uVar8,z_01,0);
          dVar4 = (double)(fVar16 + -8.0);
          depth[lVar10][lVar13] = dVar4;
          lVar13 = 8;
          do {
            dVar18 = sampleSurfaceNoiseBetween
                               (sn,uVar8,(int)lVar13,z_01,
                                (isEndChunkEmpty::inverse_drop[lVar13] - dVar4) + -0.001,
                                (isEndChunkEmpty::inverse_drop[lVar13] - dVar4) + 0.001);
            if (0.0 < ((dVar18 + dVar4 + 3000.0) * isEndChunkEmpty::upper_drop[lVar13] + -3000.0 +
                      30.0) * isEndChunkEmpty::lower_drop[lVar13] + -30.0) {
              return 0;
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 != 0xf);
          lVar13 = 1;
          bVar7 = false;
        } while (bVar14);
        lVar10 = 1;
        bVar7 = false;
      } while (bVar6);
      lVar10 = 0x10;
      uVar8 = uVar5;
      do {
        fVar16 = getEndHeightNoise(en,uVar8,z + 2,0);
        *(double *)((long)depth[0] + lVar10) = (double)(fVar16 + -8.0);
        uVar8 = uVar8 + 1;
        lVar10 = lVar10 + 0x18;
      } while (lVar10 != 0x58);
      local_4e0 = 0;
      fVar16 = getEndHeightNoise(en,uVar5 + 2,z,0);
      fVar17 = getEndHeightNoise(en,uVar5 + 2,z | 1,0);
      depth[2][0] = (double)(fVar16 + -8.0);
      depth[2][1] = (double)(fVar17 + -8.0);
      do {
        lVar10 = 0;
        do {
          dVar4 = depth[local_4e0][lVar10];
          lVar13 = 2;
          do {
            dVar18 = isEndChunkEmpty::inverse_drop[lVar13] - dVar4;
            dVar18 = sampleSurfaceNoiseBetween
                               (sn,uVar5 + (int)local_4e0,(int)lVar13,z + (int)lVar10,
                                dVar18 + -0.001,dVar18 + 0.001);
            if (0.0 < ((dVar18 + dVar4 + 3000.0) * isEndChunkEmpty::upper_drop[lVar13] + -3000.0 +
                      30.0) * isEndChunkEmpty::lower_drop[lVar13] + -30.0) {
              mapEndSurfaceHeight(y,en,sn,x,z_00,0x10,0x10,1,0);
              lVar10 = 0;
              while ((y[lVar10] == 0.0 && (!NAN(y[lVar10])))) {
                lVar10 = lVar10 + 1;
                if (lVar10 == 0x100) {
                  return 1;
                }
              }
              return 0;
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 != 0x12);
          lVar10 = lVar10 + 1;
        } while (lVar10 != 3);
        local_4e0 = local_4e0 + 1;
      } while (local_4e0 != 3);
      return 1;
    }
  } while( true );
}

Assistant:

int isEndChunkEmpty(const EndNoise *en, const SurfaceNoise *sn, uint64_t seed,
    int chunkX, int chunkZ)
{
    int i, j, k;
    int x = chunkX * 2;
    int z = chunkZ * 2;
    double depth[3][3];
    float y[256];

    // check if small end islands intersect this chunk
    for (j = -1; j <= +1; j++)
    {
        for (i = -1; i <= +1; i++)
        {
            EndIsland is[2];
            int n = getEndIslands(is, en->mc, seed, chunkX+i, chunkZ+j);
            while (n --> 0)
            {
                if (is[n].x + is[n].r <= chunkX*16) continue;
                if (is[n].z + is[n].r <= chunkZ*16) continue;
                if (is[n].x - is[n].r > chunkX*16 + 15) continue;
                if (is[n].z - is[n].r > chunkZ*16 + 15) continue;
                int id;
                mapEndBiome(en, &id, is[n].x >> 4, is[n].z >> 4, 1, 1);
                if (id == small_end_islands)
                    return 0;
            }
        }
    }

    // clamped (32 + 46 - y) / 64.0
    static const double upper_drop[] = {
           1.0,    1.0,    1.0,    1.0,    1.0,    1.0,    1.0,    1.0, // 0-7
           1.0,    1.0,    1.0,    1.0,    1.0,    1.0,    1.0, 63./64, // 8-15
        62./64, 61./64, 60./64, 59./64, 58./64, 57./64, 56./64, 55./64, // 16-23
        54./64, 53./64, 52./64, 51./64, 50./64, 49./64, 48./64, 47./64, // 24-31
        46./64 // 32
    };
    // clamped (y - 1) / 7.0
    static const double lower_drop[] = {
          0.0,  0.0, 1./7, 2./7, 3./7, 4./7, 5./7, 6./7, // 0-7
          1.0,  1.0,  1.0,  1.0,  1.0,  1.0,  1.0,  1.0, // 8-15
          1.0,  1.0,  1.0,  1.0,  1.0,  1.0,  1.0,  1.0, // 16-23
          1.0,  1.0,  1.0,  1.0,  1.0,  1.0,  1.0,  1.0, // 24-31
          1.0, // 32
    };
    // inverse of clamping func: ( 30 * (1-l) / l + 3000 * (1-u) ) / u
    static const double inverse_drop[] = {
        1e9, 1e9, 180.0, 75.0, 40.0, 22.5, 12.0, 5.0, // 0-7
        0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, // 8-14
        1000./21, 3000./31, 9000./61, 200.0, // 15-18
    };
    const double eps = 0.001;

    // get the inner depth values and see if they imply blocks in the chunk
    for (i = 0; i < 2; i++)
    {
        for (j = 0; j < 2; j++)
        {
            depth[i][j] = getEndHeightNoise(en, x+i, z+j, 0) - 8.0f;
            for (k = 8; k <= 14; k++)
            {
                double u = upper_drop[k];
                double l = lower_drop[k];
                double noise = depth[i][j];
                double pivot = inverse_drop[k] - noise;
                noise += sampleSurfaceNoiseBetween(sn, x+i, k, z+j, pivot-eps, pivot+eps);
                noise = lerp(u, -3000, noise);
                noise = lerp(l, -30, noise);
                if (noise > 0)
                    return 0;
            }
        }
    }

    // fill in the depth values at the boundaries to neighbouring chunks
    for (i = 0; i < 3; i++)
        depth[i][2] = getEndHeightNoise(en, x+i, z+2, 0) - 8.0f;
    for (j = 0; j < 2; j++)
        depth[2][j] = getEndHeightNoise(en, x+2, z+j, 0) - 8.0f;

    // see if none of the noise values can generate blocks
    for (i = 0; i < 3; i++)
    {
        for (j = 0; j < 3; j++)
        {
            for (k = 2; k < 18; k++)
            {
                double u = upper_drop[k];
                double l = lower_drop[k];
                double noise = depth[i][j];
                double pivot = inverse_drop[k] - noise;
                noise += sampleSurfaceNoiseBetween(sn, x+i, k, z+j, pivot-eps, pivot+eps);
                noise = lerp(u, -3000, noise);
                noise = lerp(l, -30, noise);
                if (noise > 0)
                    goto L_check_full;
            }
        }
    }
    return 1;

L_check_full:
    mapEndSurfaceHeight(y, en, sn, chunkX*16, chunkZ*16, 16, 16, 1, 0);
    for (k = 0; k < 256; k++)
        if (y[k] != 0) return 0;
    return 1;
}